

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmRestrictions.cpp
# Opt level: O3

void __thiscall
GmmLib::GmmTextureCalc::GetResRestrictions
          (GmmTextureCalc *this,GMM_TEXTURE_INFO *pTexinfo,__GMM_BUFFER_TYPE *Restrictions)

{
  anon_struct_8_44_94931171_for_Info aVar1;
  anon_struct_8_38_77a33f9e_for__SKU_FEATURE_TABLE_2 aVar2;
  uint32_t uVar3;
  uint uVar4;
  uint uVar5;
  GMM_PLATFORM_INFO *pGVar6;
  __GMM_BUFFER_TYPE *p_Var7;
  anon_struct_8_45_9b07292e_for_Gpu aVar8;
  GMM_RESOURCE_TYPE GVar9;
  long lVar10;
  uint uVar11;
  __GMM_BUFFER_TYPE *p_Var12;
  byte bVar13;
  GMM_RESOURCE_FLAG ZeroGpuFlags;
  
  bVar13 = 0;
  if (this->pGmmLibContext == (GMM_LIB_CONTEXT *)0x0) {
    return;
  }
  pGVar6 = GmmGetPlatformInfo(this->pGmmLibContext);
  if ((pTexinfo->Type - RESOURCE_KMD_CHECK_END < 0xffffffed) &&
     ((pTexinfo->Flags).Gpu == (anon_struct_8_45_9b07292e_for_Gpu)0x0)) {
    return;
  }
  Restrictions->MinDepth = 0xffffffff;
  switch(pTexinfo->Type) {
  default:
    (*this->_vptr_GmmTextureCalc[1])(this,pTexinfo,Restrictions);
    goto LAB_001a3bc7;
  case RESOURCE_PRIMARY:
  case RESOURCE_SHADOW:
  case RESOURCE_STAGING:
    (*this->_vptr_GmmTextureCalc[5])(this,pTexinfo,Restrictions);
    goto LAB_001a3bc7;
  case RESOURCE_CURSOR:
  case RESOURCE_FBC:
  case RESOURCE_PWR_CONTEXT:
  case RESOURCE_PERF_DATA_QUEUE:
  case RESOURCE_KMD_BUFFER:
  case RESOURCE_GLOBAL_BUFFER:
  case RESOURCE_NULL_CONTEXT_INDIRECT_STATE:
  case RESOURCE_GFX_CLIENT_BUFFER:
    p_Var7 = &pGVar6->Cursor;
    break;
  case RESOURCE_HW_CONTEXT:
  case RESOURCE_TAG_PAGE:
    if ((*(ushort *)&(pTexinfo->Flags).Info.field_0x4 & 0x81c) != 0) {
      return;
    }
    (*this->_vptr_GmmTextureCalc[4])(this,pTexinfo,Restrictions);
    goto LAB_001a3bc7;
  case RESOURCE_NNDI:
    p_Var7 = &pGVar6->Nndi;
    break;
  case RESOURCE_HARDWARE_MBM:
  case RESOURCE_IFFS_MAPTOGTT:
    if (((pTexinfo->Flags).Gpu.field_0x2 & 8) != 0) goto switchD_001a3ba0_caseD_15;
    p_Var7 = &pGVar6->HardwareMBM;
    break;
  case RESOURCE_OVERLAY_DMA:
    p_Var7 = &pGVar6->NoRestriction;
    break;
  case RESOURCE_OVERLAY_INTERMEDIATE_SURFACE:
switchD_001a3ba0_caseD_15:
    p_Var7 = &pGVar6->Overlay;
  }
  p_Var12 = Restrictions;
  for (lVar10 = 0xc; lVar10 != 0; lVar10 = lVar10 + -1) {
    uVar3 = p_Var7->PitchAlignment;
    p_Var12->Alignment = p_Var7->Alignment;
    p_Var12->PitchAlignment = uVar3;
    p_Var7 = (__GMM_BUFFER_TYPE *)((long)p_Var7 + (ulong)bVar13 * -0x10 + 8);
    p_Var12 = (__GMM_BUFFER_TYPE *)((long)p_Var12 + (ulong)bVar13 * -0x10 + 8);
  }
LAB_001a3bc7:
  if (((uint)(pTexinfo->Flags).Wa & 6) != 0) {
    Restrictions->Alignment = Restrictions->Alignment + 0x7fff & 0xffff8000;
  }
  if ((((this->pGmmLibContext->WaTable).field_0x4 & 0x20) != 0) &&
     (pTexinfo->Type == RESOURCE_HW_CONTEXT)) {
    Restrictions->Alignment = Restrictions->Alignment + 0xffff & 0xffff0000;
  }
  aVar8 = (pTexinfo->Flags).Gpu;
  if ((((aVar8._0_4_ >> 0x18 & 1) != 0) && (((pTexinfo->Flags).Info.field_0x2 & 8) != 0)) &&
     (((uint)(this->pGmmLibContext->SkuTable).field_5 & 2) == 0)) {
    Restrictions->Alignment = 0x1000;
    Restrictions->PitchAlignment = 0x1000;
    aVar8 = (pTexinfo->Flags).Gpu;
  }
  if (((ulong)aVar8 >> 0x23 & 1) != 0) {
    Restrictions->Alignment = Restrictions->Alignment + 0xffff & 0xffff0000;
    GVar9 = pTexinfo->Type;
    if (GVar9 != RESOURCE_BUFFER) goto LAB_001a3c54;
    Restrictions->PitchAlignment = Restrictions->PitchAlignment + 0xffff & 0xffff0000;
  }
  GVar9 = pTexinfo->Type;
LAB_001a3c54:
  if (((GVar9 == RESOURCE_PRIMARY) || (((ulong)(pTexinfo->Flags).Gpu & 0x80) != 0)) &&
     ((*(ushort *)&(pTexinfo->Flags).Info.field_0x4 & 0x830) != 0)) {
    Restrictions->Alignment = 0x100000;
  }
  aVar1 = (pTexinfo->Flags).Info;
  aVar2 = (this->pGmmLibContext->SkuTable).field_1;
  if ((((ulong)aVar1 & 0x20100000) != 0) ||
     ((((ulong)aVar1 >> 0x2d & 1) == 0 && (((ulong)aVar2 & 0x400000000) != 0)))) {
    if ((aVar2._0_4_ >> 0x19 & 1) == 0) {
      uVar5 = *(uint *)&(this->pGmmLibContext->WaTable).field_0x8;
      uVar11 = 0xffff;
      if (-1 < (short)uVar5) {
        uVar11 = 0xfffff;
      }
      uVar4 = 0x3fff;
      if ((uVar5 >> 0xe & 1) == 0) {
        uVar4 = uVar11;
      }
      uVar5 = ~uVar4 & Restrictions->Alignment + uVar4;
    }
    else {
      uVar5 = Restrictions->Alignment + 0x7f + (uint)(((ulong)aVar2 & 0x400000000) >> 0x22) * 0x80 &
              (((ulong)aVar2 & 0x400000000) == 0 | 0xfffffffe) << 7;
    }
    Restrictions->Alignment = uVar5;
  }
  return;
}

Assistant:

void GmmLib::GmmTextureCalc::GetResRestrictions(GMM_TEXTURE_INFO * pTexinfo,
                                                __GMM_BUFFER_TYPE &Restrictions)
{
    GMM_DPF_ENTER;
    const GMM_PLATFORM_INFO *pPlatform = NULL;
    GMM_RESOURCE_FLAG        ZeroGpuFlags;

    __GMM_ASSERTPTR(pGmmLibContext, VOIDRETURN);

    pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexinfo, pGmmLibContext);

    // Check that at least one usage flag is set for allocations other than
    // Primary/Shadow/Staging.
    memset(&ZeroGpuFlags.Gpu, 0, sizeof(ZeroGpuFlags.Gpu));
    if((pTexinfo->Type <= RESOURCE_KMD_CHECK_START ||
        pTexinfo->Type >= RESOURCE_KMD_CHECK_END) &&
       !memcmp(&pTexinfo->Flags.Gpu, &ZeroGpuFlags.Gpu, sizeof(ZeroGpuFlags.Gpu)))
    {
        GMM_ASSERTDPF(0, "No GPU Usage specified!");
        return;
    }

    ResetRestrictions(&Restrictions); //Set to Default

    // Get worst case restrictions that match GPU flags set in resource
    switch(pTexinfo->Type)
    {
        case RESOURCE_1D:
        case RESOURCE_2D:
        case RESOURCE_3D:
        case RESOURCE_CUBE:
        case RESOURCE_BUFFER:
        case RESOURCE_SCRATCH:
        case RESOURCE_GDI:
            GetGenericRestrictions(pTexinfo, &Restrictions);
            break;

        case RESOURCE_HW_CONTEXT:
        case RESOURCE_TAG_PAGE:
            if(pTexinfo->Flags.Info.TiledW ||
               pTexinfo->Flags.Info.TiledX ||
               GMM_IS_4KB_TILE(pTexinfo->Flags))
            {
                GMM_ASSERTDPF(0, "Tiled Pref specified for RESOURCE_LINEAR!");
                return;
            }
            GetLinearRestrictions(pTexinfo, &Restrictions);
            break;

        case RESOURCE_PRIMARY:
        case RESOURCE_SHADOW:
        case RESOURCE_STAGING:
            GetPrimaryRestrictions(pTexinfo, &Restrictions);
            break;

        case RESOURCE_NNDI:
            Restrictions = pPlatform->Nndi;
            break;

        case RESOURCE_HARDWARE_MBM:
        case RESOURCE_IFFS_MAPTOGTT:
            //Hardware MBM resource request can come for overlay allocation or normal
            //displayable allocation. So get the restrictions accordingly
            if(pTexinfo->Flags.Gpu.Overlay)
            {
                Restrictions = pPlatform->Overlay;
            }
            else
            {
                Restrictions = pPlatform->HardwareMBM;
            }
            break;

        case RESOURCE_CURSOR:
        case RESOURCE_PWR_CONTEXT:
        case RESOURCE_KMD_BUFFER:
        case RESOURCE_NULL_CONTEXT_INDIRECT_STATE:
        case RESOURCE_PERF_DATA_QUEUE:
        case RESOURCE_GLOBAL_BUFFER:
        case RESOURCE_FBC:
        case RESOURCE_GFX_CLIENT_BUFFER:
            Restrictions = pPlatform->Cursor;
            break;

        case RESOURCE_OVERLAY_DMA:
            Restrictions = pPlatform->NoRestriction;
            break;

        case RESOURCE_GTT_TRANSFER_REGION:
            GetGenericRestrictions(pTexinfo, &Restrictions);
            break;

        case RESOURCE_OVERLAY_INTERMEDIATE_SURFACE:
            Restrictions = pPlatform->Overlay;
            break;

        default:
            GetGenericRestrictions(pTexinfo, &Restrictions);
            GMM_ASSERTDPF(0, "Unkown Resource type");
    }
    // Apply any specific WA

    if(((pTexinfo->Flags.Wa.ILKNeedAvcMprRowStore32KAlign)) ||
       ((pTexinfo->Flags.Wa.ILKNeedAvcDmvBuffer32KAlign)))
    {
        Restrictions.Alignment = GFX_ALIGN(Restrictions.Alignment, GMM_KBYTE(32));
    }

    if(pGmmLibContext->GetWaTable().WaAlignContextImage && (pTexinfo->Type == RESOURCE_HW_CONTEXT))
    {
        Restrictions.Alignment = GFX_ALIGN(Restrictions.Alignment, GMM_KBYTE(64));
    }

    if(pTexinfo->Flags.Gpu.S3d &&
       pTexinfo->Flags.Info.Linear &&
       !pGmmLibContext->GetSkuTable().FtrDisplayEngineS3d)
    {
        Restrictions.Alignment      = PAGE_SIZE;
        Restrictions.PitchAlignment = PAGE_SIZE;
    }

    if(pTexinfo->Flags.Gpu.TiledResource)
    {
        // Need at least 64KB alignment to track tile mappings (h/w or s/w tracking).
        Restrictions.Alignment = GFX_ALIGN(Restrictions.Alignment, GMM_KBYTE(64));

        // Buffer tiled resources are trivially divided into 64KB tiles => Pitch must divide into 64KB tiles
        if(pTexinfo->Type == RESOURCE_BUFFER)
        {
            Restrictions.PitchAlignment = GFX_ALIGN(Restrictions.PitchAlignment, GMM_KBYTE(64));
        }

    }

    // SKL TileY Display needs 1MB alignment.
    if(((pTexinfo->Type == RESOURCE_PRIMARY) ||
        pTexinfo->Flags.Gpu.FlipChain) &&
       (GMM_IS_4KB_TILE(pTexinfo->Flags) ||
        pTexinfo->Flags.Info.TiledYf))
    {
        Restrictions.Alignment = GMM_MBYTE(1);
    }

    if(pTexinfo->Flags.Info.RenderCompressed ||
        pTexinfo->Flags.Info.MediaCompressed || (pGmmLibContext->GetSkuTable().FtrXe2Compression && !pTexinfo->Flags.Info.NotCompressed))
    {
        if(pGmmLibContext->GetSkuTable().FtrFlatPhysCCS)
        {
            Restrictions.Alignment = pGmmLibContext->GetSkuTable().FtrXe2Compression ? GFX_ALIGN(Restrictions.Alignment, GMM_BYTES(256)) : GFX_ALIGN(Restrictions.Alignment, GMM_BYTES(128));
        }
        else // only for platforms having auxtable
        {
            Restrictions.Alignment = GFX_ALIGN(Restrictions.Alignment, (WA16K(pGmmLibContext) ? GMM_KBYTE(16) : WA64K(pGmmLibContext) ? GMM_KBYTE(64) : GMM_MBYTE(1)));
	    }
    }

    GMM_DPF_EXIT;
}